

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::Molecule::getCom(Vector3d *__return_storage_ptr__,Molecule *this,int snapshotNo)

{
  double *pdVar1;
  double dVar2;
  uint i;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  StuntDouble *pSVar5;
  pointer ppSVar6;
  double dVar7;
  double local_68 [4];
  double local_48 [4];
  
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  ppSVar6 = (this->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar6 ==
      (this->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar5 = (StuntDouble *)0x0;
  }
  else {
    pSVar5 = *ppSVar6;
  }
  dVar7 = 0.0;
  while (pSVar5 != (StuntDouble *)0x0) {
    dVar2 = pSVar5->mass_;
    iVar3 = (*pSVar5->snapshotMan_->_vptr_SnapshotManager[4])
                      (pSVar5->snapshotMan_,(ulong)(uint)snapshotNo);
    lVar4 = *(long *)(CONCAT44(extraout_var,iVar3) + pSVar5->storage_);
    pdVar1 = (double *)(lVar4 + (long)pSVar5->localIndex_ * 0x18);
    local_48[0] = *pdVar1;
    local_48[1] = pdVar1[1];
    local_48[2] = (double)*(undefined8 *)(lVar4 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    lVar4 = 0;
    do {
      local_68[lVar4] = local_48[lVar4] * dVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar4] =
           local_68[lVar4] + (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    ppSVar6 = ppSVar6 + 1;
    if (ppSVar6 ==
        (this->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar5 = (StuntDouble *)0x0;
    }
    else {
      pSVar5 = *ppSVar6;
    }
    dVar7 = dVar7 + dVar2;
  }
  lVar4 = 0;
  do {
    (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar4] =
         (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar4] / dVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return __return_storage_ptr__;
}

Assistant:

Vector3d Molecule::getCom(int snapshotNo) {
    StuntDouble* sd;
    std::vector<StuntDouble*>::iterator i;
    Vector3d com {};
    RealType totalMass {};
    RealType mass {};

    for (sd = beginIntegrableObject(i); sd != NULL;
         sd = nextIntegrableObject(i)) {
      mass = sd->getMass();
      totalMass += mass;
      com += sd->getPos(snapshotNo) * mass;
    }

    com /= totalMass;

    return com;
  }